

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O0

ecs_type_t ecs_iter_type(ecs_iter_t *it)

{
  ecs_table_t *table;
  ecs_iter_t *it_local;
  
  _ecs_assert(it->table != (ecs_iter_table_t *)0x0,2,(char *)0x0,"it->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0xe6);
  if (it->table != (ecs_iter_table_t *)0x0) {
    return it->table->table->type;
  }
  __assert_fail("it->table != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                ,0xe6,"ecs_type_t ecs_iter_type(const ecs_iter_t *)");
}

Assistant:

ecs_type_t ecs_iter_type(
    const ecs_iter_t *it)
{
    /* If no table is set it means that the iterator isn't pointing to anything
     * yet. The most likely cause for this is that the operation is invoked on
     * a new iterator for which "next" hasn't been invoked yet, or on an
     * iterator that is out of elements. */
    ecs_assert(it->table != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_table_t *table = it->table->table;
    return table->type;
}